

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::emplacePriority<helics::ActionMessage>
          (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this,
          ActionMessage *args)

{
  bool bVar1;
  unique_lock<std::mutex> *in_RDI;
  bool *unaff_retaddr;
  atomic<bool> *in_stack_00000008;
  unique_lock<std::mutex> pullLock_1;
  unique_lock<std::mutex> pullLock;
  bool expEmpty;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  unique_lock<std::mutex> *puVar2;
  
  puVar2 = in_RDI;
  bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                    (in_stack_00000008,unaff_retaddr,SUB81((ulong)in_RDI >> 0x38,0),
                     (memory_order)in_RDI);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffaf);
    CLI::std::
    queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::emplace<helics::ActionMessage>
              ((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                *)in_RDI,
               (ActionMessage *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  }
  else {
    std::unique_lock<std::mutex>::unique_lock
              (in_RDI,(mutex_type *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    CLI::std::
    queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
    ::emplace<helics::ActionMessage>
              ((queue<helics::ActionMessage,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>
                *)in_RDI,
               (ActionMessage *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    bVar1 = CLI::std::atomic<bool>::compare_exchange_strong
                      (in_stack_00000008,unaff_retaddr,SUB81((ulong)puVar2 >> 0x38,0),
                       (memory_order)puVar2);
    if (bVar1) {
      std::condition_variable::notify_all();
    }
    std::unique_lock<std::mutex>::~unique_lock(in_RDI);
  }
  return;
}

Assistant:

void emplacePriority(Args&&... args)
        {
            bool expEmpty = true;
            if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                std::unique_lock<MUTEX> pullLock(m_pullLock);  // first pullLock
                queueEmptyFlag = false;  // need to set the flag again just in
                                         // case after we get the lock
                priorityQueue.emplace(std::forward<Args>(args)...);
                // pullLock.unlock ();
                condition.notify_all();
            } else {
                std::unique_lock<MUTEX> pullLock(m_pullLock);
                priorityQueue.emplace(std::forward<Args>(args)...);
                expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    condition.notify_all();
                }
            }
        }